

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.h
# Opt level: O3

double projects::ipdg_stokes::post_processing::
       L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                 (shared_ptr<const_lf::mesh::Mesh> *mesh,
                 MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                 *f,anon_class_1_0_00000001 *qr_selector)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>
  *mf;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>
  *extraout_RDX;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>
  *mf_00;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>
  *extraout_RDX_00;
  long lVar2;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>_>
  __x;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>_>
  MVar3;
  double dVar4;
  undefined1 auVar5 [16];
  DenseStorage<double,__1,__1,_1,_0> local_80;
  undefined **local_70;
  int local_68;
  anon_class_1_0_00000001 local_60 [16];
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  DenseStorage<double,__1,__1,_1,_0> local_40;
  undefined **local_30;
  int local_28;
  
  peVar1 = (f->a_).grad_.fe_space_.
           super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this = (f->a_).grad_.fe_space_.
         super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_80,(DenseStorage<double,__1,__1,_1,_0> *)&(f->a_).grad_.dof_vector_);
  local_68 = (f->b_).f_.n;
  local_70 = &PTR__MeshFunctionGlobal_0049f100;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  local_50 = peVar1;
  local_48 = this;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_40,&local_80);
  local_30 = &PTR__MeshFunctionGlobal_0049f100;
  local_28 = local_68;
  free(local_80.m_data);
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  auVar5 = (*(code *)(mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr[2]._vptr_Mesh)(mesh,0);
  mf = auVar5._8_8_;
  __x = lf::fe::internal::
        LocalIntegral<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>>,main::__6>
                  ((Entity *)*auVar5._0_8_,local_60,mf);
  if (mf != (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>
             *)0x1) {
    lVar2 = 8;
    mf_00 = extraout_RDX;
    do {
      MVar3 = lf::fe::internal::
              LocalIntegral<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>>,main::__6>
                        (*(Entity **)((long)auVar5._0_8_ + lVar2),local_60,mf_00);
      __x = __x + MVar3;
      lVar2 = lVar2 + 8;
      mf_00 = extraout_RDX_00;
    } while ((long)mf << 3 != lVar2);
  }
  if (__x < 0.0) {
    dVar4 = sqrt(__x);
  }
  else {
    dVar4 = SQRT(__x);
  }
  free(local_40.m_data);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return dVar4;
}

Assistant:

double L2norm(const std::shared_ptr<const lf::mesh::Mesh> &mesh, const MF &f,
              const QR_SELECTOR &qr_selector) {
  return std::sqrt(lf::fe::IntegrateMeshFunction(
      *mesh, lf::mesh::utils::squaredNorm(f), qr_selector));
}